

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# FBXConverter.cpp
# Opt level: O3

void __thiscall Assimp::FBX::FBXConverter::ConvertGlobalSettings(FBXConverter *this)

{
  char *pcVar1;
  aiScene *paVar2;
  FileGlobalSettings *pFVar3;
  ulong uVar4;
  int iVar5;
  FrameRate FVar6;
  aiMetadata *paVar7;
  aiString *paVar8;
  aiMetadataEntry *__s;
  int *piVar9;
  double *pdVar10;
  undefined4 *puVar11;
  undefined8 *puVar12;
  FrameRate *pFVar13;
  uint64_t uVar14;
  uint64_t *puVar15;
  long lVar16;
  float fVar17;
  undefined4 extraout_XMM0_Dc;
  undefined4 extraout_XMM0_Dd;
  aiVector3D aVar18;
  undefined1 *local_68;
  ulong local_60;
  undefined1 local_58 [16];
  undefined1 local_48 [16];
  float local_34;
  
  paVar2 = this->out;
  if (paVar2 == (aiScene *)0x0) {
    return;
  }
  paVar7 = (aiMetadata *)operator_new(0x18);
  paVar7->mNumProperties = 0xf;
  paVar8 = (aiString *)operator_new__(0x3c3c);
  lVar16 = 5;
  do {
    pcVar1 = paVar8->data + lVar16 + -9;
    pcVar1[0] = '\0';
    pcVar1[1] = '\0';
    pcVar1[2] = '\0';
    pcVar1[3] = '\0';
    paVar8->data[lVar16 + -5] = '\0';
    memset(paVar8->data + lVar16 + -4,0x1b,0x3ff);
    lVar16 = lVar16 + 0x404;
  } while (lVar16 != 0x3c41);
  paVar7->mKeys = paVar8;
  __s = (aiMetadataEntry *)operator_new__(0xf0);
  memset(__s,0,0xf0);
  paVar7->mValues = __s;
  paVar2->mMetaData = paVar7;
  paVar7 = this->out->mMetaData;
  local_68 = local_58;
  std::__cxx11::string::_M_construct<char_const*>((string *)&local_68,"UpAxis","");
  pFVar3 = (this->doc->globals)._M_t.
           super___uniq_ptr_impl<Assimp::FBX::FileGlobalSettings,_std::default_delete<Assimp::FBX::FileGlobalSettings>_>
           ._M_t.
           super__Tuple_impl<0UL,_Assimp::FBX::FileGlobalSettings_*,_std::default_delete<Assimp::FBX::FileGlobalSettings>_>
           .super__Head_base<0UL,_Assimp::FBX::FileGlobalSettings_*,_false>._M_head_impl;
  if (pFVar3 != (FileGlobalSettings *)0x0) {
    iVar5 = FileGlobalSettings::UpAxis(pFVar3);
    uVar4 = local_60;
    if ((paVar7->mNumProperties != 0) && (local_60 != 0)) {
      if (local_60 < 0x400) {
        paVar8 = paVar7->mKeys;
        paVar8->length = (ai_uint32)local_60;
        memcpy(paVar8->data,local_68,local_60);
        paVar8->data[uVar4] = '\0';
      }
      paVar7->mValues->mType = AI_INT32;
      piVar9 = (int *)operator_new(4);
      *piVar9 = iVar5;
      paVar7->mValues->mData = piVar9;
    }
    if (local_68 != local_58) {
      operator_delete(local_68);
    }
    paVar7 = this->out->mMetaData;
    local_68 = local_58;
    std::__cxx11::string::_M_construct<char_const*>((string *)&local_68,"UpAxisSign","");
    pFVar3 = (this->doc->globals)._M_t.
             super___uniq_ptr_impl<Assimp::FBX::FileGlobalSettings,_std::default_delete<Assimp::FBX::FileGlobalSettings>_>
             ._M_t.
             super__Tuple_impl<0UL,_Assimp::FBX::FileGlobalSettings_*,_std::default_delete<Assimp::FBX::FileGlobalSettings>_>
             .super__Head_base<0UL,_Assimp::FBX::FileGlobalSettings_*,_false>._M_head_impl;
    if (pFVar3 != (FileGlobalSettings *)0x0) {
      iVar5 = FileGlobalSettings::UpAxisSign(pFVar3);
      uVar4 = local_60;
      if ((1 < paVar7->mNumProperties) && (local_60 != 0)) {
        if (local_60 < 0x400) {
          paVar8 = paVar7->mKeys;
          paVar8[1].length = (ai_uint32)local_60;
          memcpy(paVar8[1].data,local_68,local_60);
          paVar8[1].data[uVar4] = '\0';
        }
        paVar7->mValues[1].mType = AI_INT32;
        piVar9 = (int *)operator_new(4);
        *piVar9 = iVar5;
        paVar7->mValues[1].mData = piVar9;
      }
      if (local_68 != local_58) {
        operator_delete(local_68);
      }
      paVar7 = this->out->mMetaData;
      local_68 = local_58;
      std::__cxx11::string::_M_construct<char_const*>((string *)&local_68,"FrontAxis","");
      pFVar3 = (this->doc->globals)._M_t.
               super___uniq_ptr_impl<Assimp::FBX::FileGlobalSettings,_std::default_delete<Assimp::FBX::FileGlobalSettings>_>
               ._M_t.
               super__Tuple_impl<0UL,_Assimp::FBX::FileGlobalSettings_*,_std::default_delete<Assimp::FBX::FileGlobalSettings>_>
               .super__Head_base<0UL,_Assimp::FBX::FileGlobalSettings_*,_false>._M_head_impl;
      if (pFVar3 != (FileGlobalSettings *)0x0) {
        iVar5 = FileGlobalSettings::FrontAxis(pFVar3);
        uVar4 = local_60;
        if ((2 < paVar7->mNumProperties) && (local_60 != 0)) {
          if (local_60 < 0x400) {
            paVar8 = paVar7->mKeys;
            paVar8[2].length = (ai_uint32)local_60;
            memcpy(paVar8[2].data,local_68,local_60);
            paVar8[2].data[uVar4] = '\0';
          }
          paVar7->mValues[2].mType = AI_INT32;
          piVar9 = (int *)operator_new(4);
          *piVar9 = iVar5;
          paVar7->mValues[2].mData = piVar9;
        }
        if (local_68 != local_58) {
          operator_delete(local_68);
        }
        paVar7 = this->out->mMetaData;
        local_68 = local_58;
        std::__cxx11::string::_M_construct<char_const*>((string *)&local_68,"FrontAxisSign","");
        pFVar3 = (this->doc->globals)._M_t.
                 super___uniq_ptr_impl<Assimp::FBX::FileGlobalSettings,_std::default_delete<Assimp::FBX::FileGlobalSettings>_>
                 ._M_t.
                 super__Tuple_impl<0UL,_Assimp::FBX::FileGlobalSettings_*,_std::default_delete<Assimp::FBX::FileGlobalSettings>_>
                 .super__Head_base<0UL,_Assimp::FBX::FileGlobalSettings_*,_false>._M_head_impl;
        if (pFVar3 != (FileGlobalSettings *)0x0) {
          iVar5 = FileGlobalSettings::FrontAxisSign(pFVar3);
          uVar4 = local_60;
          if ((3 < paVar7->mNumProperties) && (local_60 != 0)) {
            if (local_60 < 0x400) {
              paVar8 = paVar7->mKeys;
              paVar8[3].length = (ai_uint32)local_60;
              memcpy(paVar8[3].data,local_68,local_60);
              paVar8[3].data[uVar4] = '\0';
            }
            paVar7->mValues[3].mType = AI_INT32;
            piVar9 = (int *)operator_new(4);
            *piVar9 = iVar5;
            paVar7->mValues[3].mData = piVar9;
          }
          if (local_68 != local_58) {
            operator_delete(local_68);
          }
          paVar7 = this->out->mMetaData;
          local_68 = local_58;
          std::__cxx11::string::_M_construct<char_const*>((string *)&local_68,"CoordAxis","");
          pFVar3 = (this->doc->globals)._M_t.
                   super___uniq_ptr_impl<Assimp::FBX::FileGlobalSettings,_std::default_delete<Assimp::FBX::FileGlobalSettings>_>
                   ._M_t.
                   super__Tuple_impl<0UL,_Assimp::FBX::FileGlobalSettings_*,_std::default_delete<Assimp::FBX::FileGlobalSettings>_>
                   .super__Head_base<0UL,_Assimp::FBX::FileGlobalSettings_*,_false>._M_head_impl;
          if (pFVar3 != (FileGlobalSettings *)0x0) {
            iVar5 = FileGlobalSettings::CoordAxis(pFVar3);
            uVar4 = local_60;
            if ((4 < paVar7->mNumProperties) && (local_60 != 0)) {
              if (local_60 < 0x400) {
                paVar8 = paVar7->mKeys;
                paVar8[4].length = (ai_uint32)local_60;
                memcpy(paVar8[4].data,local_68,local_60);
                paVar8[4].data[uVar4] = '\0';
              }
              paVar7->mValues[4].mType = AI_INT32;
              piVar9 = (int *)operator_new(4);
              *piVar9 = iVar5;
              paVar7->mValues[4].mData = piVar9;
            }
            if (local_68 != local_58) {
              operator_delete(local_68);
            }
            paVar7 = this->out->mMetaData;
            local_68 = local_58;
            std::__cxx11::string::_M_construct<char_const*>((string *)&local_68,"CoordAxisSign","");
            pFVar3 = (this->doc->globals)._M_t.
                     super___uniq_ptr_impl<Assimp::FBX::FileGlobalSettings,_std::default_delete<Assimp::FBX::FileGlobalSettings>_>
                     ._M_t.
                     super__Tuple_impl<0UL,_Assimp::FBX::FileGlobalSettings_*,_std::default_delete<Assimp::FBX::FileGlobalSettings>_>
                     .super__Head_base<0UL,_Assimp::FBX::FileGlobalSettings_*,_false>._M_head_impl;
            if (pFVar3 != (FileGlobalSettings *)0x0) {
              iVar5 = FileGlobalSettings::CoordAxisSign(pFVar3);
              uVar4 = local_60;
              if ((5 < paVar7->mNumProperties) && (local_60 != 0)) {
                if (local_60 < 0x400) {
                  paVar8 = paVar7->mKeys;
                  paVar8[5].length = (ai_uint32)local_60;
                  memcpy(paVar8[5].data,local_68,local_60);
                  paVar8[5].data[uVar4] = '\0';
                }
                paVar7->mValues[5].mType = AI_INT32;
                piVar9 = (int *)operator_new(4);
                *piVar9 = iVar5;
                paVar7->mValues[5].mData = piVar9;
              }
              if (local_68 != local_58) {
                operator_delete(local_68);
              }
              paVar7 = this->out->mMetaData;
              local_68 = local_58;
              std::__cxx11::string::_M_construct<char_const*>
                        ((string *)&local_68,"OriginalUpAxis","");
              pFVar3 = (this->doc->globals)._M_t.
                       super___uniq_ptr_impl<Assimp::FBX::FileGlobalSettings,_std::default_delete<Assimp::FBX::FileGlobalSettings>_>
                       ._M_t.
                       super__Tuple_impl<0UL,_Assimp::FBX::FileGlobalSettings_*,_std::default_delete<Assimp::FBX::FileGlobalSettings>_>
                       .super__Head_base<0UL,_Assimp::FBX::FileGlobalSettings_*,_false>._M_head_impl
              ;
              if (pFVar3 != (FileGlobalSettings *)0x0) {
                iVar5 = FileGlobalSettings::OriginalUpAxis(pFVar3);
                uVar4 = local_60;
                if ((6 < paVar7->mNumProperties) && (local_60 != 0)) {
                  if (local_60 < 0x400) {
                    paVar8 = paVar7->mKeys;
                    paVar8[6].length = (ai_uint32)local_60;
                    memcpy(paVar8[6].data,local_68,local_60);
                    paVar8[6].data[uVar4] = '\0';
                  }
                  paVar7->mValues[6].mType = AI_INT32;
                  piVar9 = (int *)operator_new(4);
                  *piVar9 = iVar5;
                  paVar7->mValues[6].mData = piVar9;
                }
                if (local_68 != local_58) {
                  operator_delete(local_68);
                }
                paVar7 = this->out->mMetaData;
                local_68 = local_58;
                std::__cxx11::string::_M_construct<char_const*>
                          ((string *)&local_68,"OriginalUpAxisSign","");
                pFVar3 = (this->doc->globals)._M_t.
                         super___uniq_ptr_impl<Assimp::FBX::FileGlobalSettings,_std::default_delete<Assimp::FBX::FileGlobalSettings>_>
                         ._M_t.
                         super__Tuple_impl<0UL,_Assimp::FBX::FileGlobalSettings_*,_std::default_delete<Assimp::FBX::FileGlobalSettings>_>
                         .super__Head_base<0UL,_Assimp::FBX::FileGlobalSettings_*,_false>.
                         _M_head_impl;
                if (pFVar3 != (FileGlobalSettings *)0x0) {
                  iVar5 = FileGlobalSettings::OriginalUpAxisSign(pFVar3);
                  uVar4 = local_60;
                  if ((7 < paVar7->mNumProperties) && (local_60 != 0)) {
                    if (local_60 < 0x400) {
                      paVar8 = paVar7->mKeys;
                      paVar8[7].length = (ai_uint32)local_60;
                      memcpy(paVar8[7].data,local_68,local_60);
                      paVar8[7].data[uVar4] = '\0';
                    }
                    paVar7->mValues[7].mType = AI_INT32;
                    piVar9 = (int *)operator_new(4);
                    *piVar9 = iVar5;
                    paVar7->mValues[7].mData = piVar9;
                  }
                  if (local_68 != local_58) {
                    operator_delete(local_68);
                  }
                  paVar7 = this->out->mMetaData;
                  local_68 = local_58;
                  std::__cxx11::string::_M_construct<char_const*>
                            ((string *)&local_68,"UnitScaleFactor","");
                  pFVar3 = (this->doc->globals)._M_t.
                           super___uniq_ptr_impl<Assimp::FBX::FileGlobalSettings,_std::default_delete<Assimp::FBX::FileGlobalSettings>_>
                           ._M_t.
                           super__Tuple_impl<0UL,_Assimp::FBX::FileGlobalSettings_*,_std::default_delete<Assimp::FBX::FileGlobalSettings>_>
                           .super__Head_base<0UL,_Assimp::FBX::FileGlobalSettings_*,_false>.
                           _M_head_impl;
                  if (pFVar3 != (FileGlobalSettings *)0x0) {
                    fVar17 = FileGlobalSettings::UnitScaleFactor(pFVar3);
                    uVar4 = local_60;
                    if ((8 < paVar7->mNumProperties) && (local_60 != 0)) {
                      local_48._0_4_ = fVar17;
                      if (local_60 < 0x400) {
                        paVar8 = paVar7->mKeys;
                        paVar8[8].length = (ai_uint32)local_60;
                        memcpy(paVar8[8].data,local_68,local_60);
                        paVar8[8].data[uVar4] = '\0';
                      }
                      paVar7->mValues[8].mType = AI_DOUBLE;
                      pdVar10 = (double *)operator_new(8);
                      *pdVar10 = (double)(float)local_48._0_4_;
                      paVar7->mValues[8].mData = pdVar10;
                    }
                    if (local_68 != local_58) {
                      operator_delete(local_68);
                    }
                    paVar7 = this->out->mMetaData;
                    local_68 = local_58;
                    std::__cxx11::string::_M_construct<char_const*>
                              ((string *)&local_68,"OriginalUnitScaleFactor","");
                    pFVar3 = (this->doc->globals)._M_t.
                             super___uniq_ptr_impl<Assimp::FBX::FileGlobalSettings,_std::default_delete<Assimp::FBX::FileGlobalSettings>_>
                             ._M_t.
                             super__Tuple_impl<0UL,_Assimp::FBX::FileGlobalSettings_*,_std::default_delete<Assimp::FBX::FileGlobalSettings>_>
                             .super__Head_base<0UL,_Assimp::FBX::FileGlobalSettings_*,_false>.
                             _M_head_impl;
                    if (pFVar3 != (FileGlobalSettings *)0x0) {
                      fVar17 = FileGlobalSettings::OriginalUnitScaleFactor(pFVar3);
                      uVar4 = local_60;
                      if ((9 < paVar7->mNumProperties) && (local_60 != 0)) {
                        local_48._0_4_ = fVar17;
                        if (local_60 < 0x400) {
                          paVar8 = paVar7->mKeys;
                          paVar8[9].length = (ai_uint32)local_60;
                          memcpy(paVar8[9].data,local_68,local_60);
                          paVar8[9].data[uVar4] = '\0';
                        }
                        paVar7->mValues[9].mType = AI_FLOAT;
                        puVar11 = (undefined4 *)operator_new(4);
                        *puVar11 = local_48._0_4_;
                        paVar7->mValues[9].mData = puVar11;
                      }
                      if (local_68 != local_58) {
                        operator_delete(local_68);
                      }
                      paVar7 = this->out->mMetaData;
                      local_68 = local_58;
                      std::__cxx11::string::_M_construct<char_const*>
                                ((string *)&local_68,"AmbientColor","");
                      pFVar3 = (this->doc->globals)._M_t.
                               super___uniq_ptr_impl<Assimp::FBX::FileGlobalSettings,_std::default_delete<Assimp::FBX::FileGlobalSettings>_>
                               ._M_t.
                               super__Tuple_impl<0UL,_Assimp::FBX::FileGlobalSettings_*,_std::default_delete<Assimp::FBX::FileGlobalSettings>_>
                               .super__Head_base<0UL,_Assimp::FBX::FileGlobalSettings_*,_false>.
                               _M_head_impl;
                      if (pFVar3 != (FileGlobalSettings *)0x0) {
                        aVar18 = FileGlobalSettings::AmbientColor(pFVar3);
                        uVar4 = local_60;
                        if ((10 < paVar7->mNumProperties) && (local_60 != 0)) {
                          local_48._8_4_ = extraout_XMM0_Dc;
                          local_48._0_8_ = aVar18._0_8_;
                          local_48._12_4_ = extraout_XMM0_Dd;
                          local_34 = aVar18.z;
                          if (local_60 < 0x400) {
                            paVar8 = paVar7->mKeys;
                            paVar8[10].length = (ai_uint32)local_60;
                            memcpy(paVar8[10].data,local_68,local_60);
                            paVar8[10].data[uVar4] = '\0';
                          }
                          paVar7->mValues[10].mType = AI_AIVECTOR3D;
                          puVar12 = (undefined8 *)operator_new(0xc);
                          *puVar12 = local_48._0_8_;
                          *(float *)(puVar12 + 1) = local_34;
                          paVar7->mValues[10].mData = puVar12;
                        }
                        if (local_68 != local_58) {
                          operator_delete(local_68);
                        }
                        paVar7 = this->out->mMetaData;
                        local_68 = local_58;
                        std::__cxx11::string::_M_construct<char_const*>
                                  ((string *)&local_68,"FrameRate","");
                        pFVar3 = (this->doc->globals)._M_t.
                                 super___uniq_ptr_impl<Assimp::FBX::FileGlobalSettings,_std::default_delete<Assimp::FBX::FileGlobalSettings>_>
                                 ._M_t.
                                 super__Tuple_impl<0UL,_Assimp::FBX::FileGlobalSettings_*,_std::default_delete<Assimp::FBX::FileGlobalSettings>_>
                                 .super__Head_base<0UL,_Assimp::FBX::FileGlobalSettings_*,_false>.
                                 _M_head_impl;
                        if (pFVar3 != (FileGlobalSettings *)0x0) {
                          FVar6 = FileGlobalSettings::TimeMode(pFVar3);
                          uVar4 = local_60;
                          if ((0xb < paVar7->mNumProperties) && (local_60 != 0)) {
                            if (local_60 < 0x400) {
                              paVar8 = paVar7->mKeys;
                              paVar8[0xb].length = (ai_uint32)local_60;
                              memcpy(paVar8[0xb].data,local_68,local_60);
                              paVar8[0xb].data[uVar4] = '\0';
                            }
                            paVar7->mValues[0xb].mType = AI_INT32;
                            pFVar13 = (FrameRate *)operator_new(4);
                            *pFVar13 = FVar6;
                            paVar7->mValues[0xb].mData = pFVar13;
                          }
                          if (local_68 != local_58) {
                            operator_delete(local_68);
                          }
                          paVar7 = this->out->mMetaData;
                          local_68 = local_58;
                          std::__cxx11::string::_M_construct<char_const*>
                                    ((string *)&local_68,"TimeSpanStart","");
                          pFVar3 = (this->doc->globals)._M_t.
                                   super___uniq_ptr_impl<Assimp::FBX::FileGlobalSettings,_std::default_delete<Assimp::FBX::FileGlobalSettings>_>
                                   ._M_t.
                                   super__Tuple_impl<0UL,_Assimp::FBX::FileGlobalSettings_*,_std::default_delete<Assimp::FBX::FileGlobalSettings>_>
                                   .super__Head_base<0UL,_Assimp::FBX::FileGlobalSettings_*,_false>.
                                   _M_head_impl;
                          if (pFVar3 != (FileGlobalSettings *)0x0) {
                            uVar14 = FileGlobalSettings::TimeSpanStart(pFVar3);
                            uVar4 = local_60;
                            if ((0xc < paVar7->mNumProperties) && (local_60 != 0)) {
                              if (local_60 < 0x400) {
                                paVar8 = paVar7->mKeys;
                                paVar8[0xc].length = (ai_uint32)local_60;
                                memcpy(paVar8[0xc].data,local_68,local_60);
                                paVar8[0xc].data[uVar4] = '\0';
                              }
                              paVar7->mValues[0xc].mType = AI_UINT64;
                              puVar15 = (uint64_t *)operator_new(8);
                              *puVar15 = uVar14;
                              paVar7->mValues[0xc].mData = puVar15;
                            }
                            if (local_68 != local_58) {
                              operator_delete(local_68);
                            }
                            paVar7 = this->out->mMetaData;
                            local_68 = local_58;
                            std::__cxx11::string::_M_construct<char_const*>
                                      ((string *)&local_68,"TimeSpanStop","");
                            pFVar3 = (this->doc->globals)._M_t.
                                     super___uniq_ptr_impl<Assimp::FBX::FileGlobalSettings,_std::default_delete<Assimp::FBX::FileGlobalSettings>_>
                                     ._M_t.
                                     super__Tuple_impl<0UL,_Assimp::FBX::FileGlobalSettings_*,_std::default_delete<Assimp::FBX::FileGlobalSettings>_>
                                     .
                                     super__Head_base<0UL,_Assimp::FBX::FileGlobalSettings_*,_false>
                                     ._M_head_impl;
                            if (pFVar3 != (FileGlobalSettings *)0x0) {
                              uVar14 = FileGlobalSettings::TimeSpanStop(pFVar3);
                              uVar4 = local_60;
                              if ((0xd < paVar7->mNumProperties) && (local_60 != 0)) {
                                if (local_60 < 0x400) {
                                  paVar8 = paVar7->mKeys;
                                  paVar8[0xd].length = (ai_uint32)local_60;
                                  memcpy(paVar8[0xd].data,local_68,local_60);
                                  paVar8[0xd].data[uVar4] = '\0';
                                }
                                paVar7->mValues[0xd].mType = AI_UINT64;
                                puVar15 = (uint64_t *)operator_new(8);
                                *puVar15 = uVar14;
                                paVar7->mValues[0xd].mData = puVar15;
                              }
                              if (local_68 != local_58) {
                                operator_delete(local_68);
                              }
                              paVar7 = this->out->mMetaData;
                              local_68 = local_58;
                              std::__cxx11::string::_M_construct<char_const*>
                                        ((string *)&local_68,"CustomFrameRate","");
                              pFVar3 = (this->doc->globals)._M_t.
                                       super___uniq_ptr_impl<Assimp::FBX::FileGlobalSettings,_std::default_delete<Assimp::FBX::FileGlobalSettings>_>
                                       ._M_t.
                                       super__Tuple_impl<0UL,_Assimp::FBX::FileGlobalSettings_*,_std::default_delete<Assimp::FBX::FileGlobalSettings>_>
                                       .
                                       super__Head_base<0UL,_Assimp::FBX::FileGlobalSettings_*,_false>
                                       ._M_head_impl;
                              if (pFVar3 != (FileGlobalSettings *)0x0) {
                                fVar17 = FileGlobalSettings::CustomFrameRate(pFVar3);
                                if ((0xe < paVar7->mNumProperties) && (local_60 != 0)) {
                                  local_48._0_4_ = fVar17;
                                  if (local_60 < 0x400) {
                                    paVar8 = paVar7->mKeys;
                                    paVar8[0xe].length = (ai_uint32)local_60;
                                    memcpy(paVar8[0xe].data,local_68,local_60);
                                    paVar8[0xe].data[local_60] = '\0';
                                  }
                                  paVar7->mValues[0xe].mType = AI_FLOAT;
                                  puVar11 = (undefined4 *)operator_new(4);
                                  *puVar11 = local_48._0_4_;
                                  paVar7->mValues[0xe].mData = puVar11;
                                }
                                if (local_68 == local_58) {
                                  return;
                                }
                                operator_delete(local_68);
                                return;
                              }
                            }
                          }
                        }
                      }
                    }
                  }
                }
              }
            }
          }
        }
      }
    }
  }
  __assert_fail("globals.get()",
                "/workspace/llm4binary/github/license_all_cmakelists_25/royalneverwin[P]Computer_graphics/third_party/assimp/code/FBX/FBXDocument.h"
                ,0x44d,"const FileGlobalSettings &Assimp::FBX::Document::GlobalSettings() const");
}

Assistant:

void FBXConverter::ConvertGlobalSettings() {
            if (nullptr == out) {
                return;
            }

            out->mMetaData = aiMetadata::Alloc(15);
            out->mMetaData->Set(0, "UpAxis", doc.GlobalSettings().UpAxis());
            out->mMetaData->Set(1, "UpAxisSign", doc.GlobalSettings().UpAxisSign());
            out->mMetaData->Set(2, "FrontAxis", doc.GlobalSettings().FrontAxis());
            out->mMetaData->Set(3, "FrontAxisSign", doc.GlobalSettings().FrontAxisSign());
            out->mMetaData->Set(4, "CoordAxis", doc.GlobalSettings().CoordAxis());
            out->mMetaData->Set(5, "CoordAxisSign", doc.GlobalSettings().CoordAxisSign());
            out->mMetaData->Set(6, "OriginalUpAxis", doc.GlobalSettings().OriginalUpAxis());
            out->mMetaData->Set(7, "OriginalUpAxisSign", doc.GlobalSettings().OriginalUpAxisSign());
            out->mMetaData->Set(8, "UnitScaleFactor", (double)doc.GlobalSettings().UnitScaleFactor());
            out->mMetaData->Set(9, "OriginalUnitScaleFactor", doc.GlobalSettings().OriginalUnitScaleFactor());
            out->mMetaData->Set(10, "AmbientColor", doc.GlobalSettings().AmbientColor());
            out->mMetaData->Set(11, "FrameRate", (int)doc.GlobalSettings().TimeMode());
            out->mMetaData->Set(12, "TimeSpanStart", doc.GlobalSettings().TimeSpanStart());
            out->mMetaData->Set(13, "TimeSpanStop", doc.GlobalSettings().TimeSpanStop());
            out->mMetaData->Set(14, "CustomFrameRate", doc.GlobalSettings().CustomFrameRate());
        }